

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_dash.cpp
# Opt level: O0

void __thiscall agg::vcgen_dash::calc_dash_start(vcgen_dash *this,double ds)

{
  double local_18;
  double ds_local;
  vcgen_dash *this_local;
  
  this->m_curr_dash = 0;
  this->m_curr_dash_start = 0.0;
  local_18 = ds;
  while (0.0 < local_18) {
    if (local_18 < this->m_dashes[this->m_curr_dash] ||
        local_18 == this->m_dashes[this->m_curr_dash]) {
      this->m_curr_dash_start = local_18;
      local_18 = 0.0;
    }
    else {
      local_18 = local_18 - this->m_dashes[this->m_curr_dash];
      this->m_curr_dash = this->m_curr_dash + 1;
      this->m_curr_dash_start = 0.0;
      if (this->m_num_dashes <= this->m_curr_dash) {
        this->m_curr_dash = 0;
      }
    }
  }
  return;
}

Assistant:

void vcgen_dash::calc_dash_start(double ds)
    {
        m_curr_dash = 0;
        m_curr_dash_start = 0.0;
        while(ds > 0.0)
        {
            if(ds > m_dashes[m_curr_dash])
            {
                ds -= m_dashes[m_curr_dash];
                ++m_curr_dash;
                m_curr_dash_start = 0.0;
                if(m_curr_dash >= m_num_dashes) m_curr_dash = 0;
            }
            else
            {
                m_curr_dash_start = ds;
                ds = 0.0;
            }
        }
    }